

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

void __thiscall
cfd::js::api::json::ElementsDecodeIssuance::ElementsDecodeIssuance(ElementsDecodeIssuance *this)

{
  allocator local_2c;
  allocator local_2b;
  allocator local_2a;
  allocator local_29;
  allocator local_28;
  allocator local_27;
  allocator local_26;
  allocator local_25 [20];
  allocator local_11;
  ElementsDecodeIssuance *local_10;
  ElementsDecodeIssuance *this_local;
  
  local_10 = this;
  core::JsonClassBase<cfd::js::api::json::ElementsDecodeIssuance>::JsonClassBase
            (&this->super_JsonClassBase<cfd::js::api::json::ElementsDecodeIssuance>);
  (this->super_JsonClassBase<cfd::js::api::json::ElementsDecodeIssuance>)._vptr_JsonClassBase =
       (_func_int **)&PTR__ElementsDecodeIssuance_01b4c570;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ignore_items);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->asset_blinding_nonce_,"",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->asset_entropy_,"",local_25);
  std::allocator<char>::~allocator((allocator<char> *)local_25);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->contract_hash_,"",&local_26);
  std::allocator<char>::~allocator((allocator<char> *)&local_26);
  this->isreissuance_ = false;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->token_,"",&local_27);
  std::allocator<char>::~allocator((allocator<char> *)&local_27);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->asset_,"",&local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_28);
  this->assetamount_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->assetamountcommitment_,"",&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  this->tokenamount_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->tokenamountcommitment_,"",&local_2a);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->asset_rangeproof_,"",&local_2b);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->token_rangeproof_,"",&local_2c);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c);
  CollectFieldName();
  return;
}

Assistant:

ElementsDecodeIssuance() {
    CollectFieldName();
  }